

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

boolean hmon(monst *mon,obj *obj,obj *ostack,boolean thrown)

{
  boolean bVar1;
  int iVar2;
  bool bVar3;
  boolean anger_guards;
  boolean result;
  boolean thrown_local;
  obj *ostack_local;
  obj *obj_local;
  monst *mon_local;
  
  bVar3 = false;
  if (((((*(uint *)&mon->field_0x60 >> 0x16 & 1) != 0) &&
       (bVar3 = true, (*(uint *)&mon->field_0x60 >> 0x1c & 1) == 0)) &&
      (bVar3 = true, (*(uint *)&mon->field_0x60 >> 0x19 & 1) == 0)) &&
     (bVar3 = true, mon->data != mons + 0x125)) {
    bVar3 = mon->data == mons + 0x126;
  }
  noisy_hit(mon,obj,ostack,(int)thrown);
  bVar1 = hmon_hitmon(mon,obj,ostack,thrown);
  if (((*(uint *)&mon->field_0x60 >> 0x1c & 1) != 0) && (iVar2 = rn2(2), iVar2 == 0)) {
    ghod_hitsu(mon);
  }
  if (bVar3) {
    angry_guards((flags.soundok != '\0' ^ 0xffU) & 1);
  }
  return bVar1;
}

Assistant:

boolean hmon(struct monst *mon, struct obj *obj,
	     struct obj *ostack, boolean thrown)
{
	boolean result, anger_guards;

	anger_guards = (mon->mpeaceful &&
			    (mon->ispriest || mon->isshk ||
			     mon->data == &mons[PM_WATCHMAN] ||
			     mon->data == &mons[PM_WATCH_CAPTAIN]));

	/* check to see if what we're doing would wake up nearby critters */
	noisy_hit(mon, obj, ostack, thrown);

	/* go ahead and 'hit' the monster */
	result = hmon_hitmon(mon, obj, ostack, thrown);

	if (mon->ispriest && !rn2(2))
	    ghod_hitsu(mon);
	if (anger_guards)
	    angry_guards(!flags.soundok);

	return result;
}